

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_korax.cpp
# Opt level: O2

int AF_A_KoraxChase(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  TObjPtr<AActor> *obj;
  VM_UBYTE VVar1;
  DObject *this;
  bool bVar2;
  int iVar3;
  int iVar4;
  AActor *pAVar5;
  AActor *pAVar6;
  AActor *this_00;
  char *__assertion;
  FActorIterator iterator;
  FSoundID local_7c;
  DAngle local_78;
  DAngle local_70;
  DVector3 local_68;
  DVector3 local_48;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0053f88e;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_0053f87e;
  this_00 = *(AActor **)&param->field_0;
  if ((param->field_0).field_1.atag == 1) {
    if (this_00 == (AActor *)0x0) goto LAB_0053f621;
    bVar2 = DObject::IsKindOf((DObject *)this_00,AActor::RegistrationInfo.MyClass);
    if (!bVar2) {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_0053f88e;
    }
  }
  else {
    if (this_00 != (AActor *)0x0) goto LAB_0053f87e;
LAB_0053f621:
    this_00 = (AActor *)0x0;
  }
  if (numparam == 1) goto LAB_0053f6a1;
  VVar1 = param[1].field_0.field_3.Type;
  if (VVar1 != 0xff) {
    if (VVar1 != '\x03') {
LAB_0053f87e:
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
      ;
      goto LAB_0053f88e;
    }
    this = (DObject *)param[1].field_0.field_1.a;
    if (param[1].field_0.field_1.atag == 1) {
      if ((this != (DObject *)0x0) &&
         (bVar2 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass), !bVar2)) {
        __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_0053f88e;
      }
    }
    else if (this != (DObject *)0x0) goto LAB_0053f87e;
  }
  if ((((uint)numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
     ((VVar1 == '\x03' &&
      ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_0053f6a1:
    if ((this_00->special2 == 0) &&
       (iVar4 = this_00->health, iVar3 = AActor::SpawnHealth(this_00), iVar4 <= iVar3 / 2)) {
      iterator.base = (AActor *)0x0;
      iterator.id = 0xf8;
      pAVar5 = FActorIterator::Next(&iterator);
      if (pAVar5 != (AActor *)0x0) {
        local_48.X = (pAVar5->__Pos).X;
        local_48.Y = (pAVar5->__Pos).Y;
        local_48.Z = -2147483648.0;
        local_70.Degrees = (pAVar5->Angles).Yaw.Degrees;
        P_Teleport(this_00,&local_48,&local_70,3);
      }
      P_StartScript(this_00,(line_t *)0x0,0xf9,(char *)0x0,(int *)0x0,0,0);
      this_00->special2 = 1;
      return 0;
    }
    pAVar5 = GC::ReadBarrier<AActor>((AActor **)&this_00->target);
    if (pAVar5 != (AActor *)0x0) {
      iVar4 = FRandom::operator()(&pr_koraxchase);
      if (iVar4 < 0x1e) {
        AActor::SetState(this_00,this_00->MissileState,false);
      }
      else {
        iVar4 = FRandom::operator()(&pr_koraxchase);
        if (iVar4 < 0x1e) {
          local_7c.ID = S_FindSound("KoraxActive");
          S_Sound(this_00,2,&local_7c,1.0,0.0);
        }
      }
      iVar4 = this_00->health;
      iVar3 = AActor::SpawnHealth(this_00);
      if ((iVar4 < iVar3 >> 1) && (iVar4 = FRandom::operator()(&pr_koraxchase), iVar4 < 10)) {
        iterator.base = (AActor *)0x0;
        iterator.id = 0xf9;
        obj = &this_00->tracer;
        pAVar5 = GC::ReadBarrier<AActor>((AActor **)obj);
        if (pAVar5 != (AActor *)0x0) {
          do {
            pAVar5 = FActorIterator::Next(&iterator);
            if (pAVar5 == (AActor *)0x0) break;
            pAVar6 = GC::ReadBarrier<AActor>((AActor **)obj);
          } while (pAVar5 != pAVar6);
        }
        pAVar5 = FActorIterator::Next(&iterator);
        (obj->field_0).p = pAVar5;
        if (pAVar5 != (AActor *)0x0) {
          local_68.X = (pAVar5->__Pos).X;
          local_68.Y = (pAVar5->__Pos).Y;
          local_68.Z = -2147483648.0;
          local_78.Degrees = (pAVar5->Angles).Yaw.Degrees;
          P_Teleport(this_00,&local_68,&local_78,3);
        }
      }
    }
    return 0;
  }
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
  ;
LAB_0053f88e:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_korax.cpp"
                ,0x5b,"int AF_A_KoraxChase(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_KoraxChase)
{
	PARAM_ACTION_PROLOGUE;

	AActor *spot;

	if ((!self->special2) && (self->health <= (self->SpawnHealth()/2)))
	{
		FActorIterator iterator (KORAX_FIRST_TELEPORT_TID);
		spot = iterator.Next ();
		if (spot != NULL)
		{
			P_Teleport (self, spot->PosAtZ(ONFLOORZ), spot->Angles.Yaw, TELF_SOURCEFOG | TELF_DESTFOG);
		}

		P_StartScript (self, NULL, 249, NULL, NULL, 0, 0);
		self->special2 = 1;	// Don't run again

		return 0;
	}

	if (self->target == NULL)
	{
		return 0;
	}
	if (pr_koraxchase()<30)
	{
		self->SetState (self->MissileState);
	}
	else if (pr_koraxchase()<30)
	{
		S_Sound (self, CHAN_VOICE, "KoraxActive", 1, ATTN_NONE);
	}

	// Teleport away
	if (self->health < (self->SpawnHealth()>>1))
	{
		if (pr_koraxchase()<10)
		{
			FActorIterator iterator (KORAX_TELEPORT_TID);

			if (self->tracer != NULL)
			{	// Find the previous teleport destination
				do
				{
					spot = iterator.Next ();
				} while (spot != NULL && spot != self->tracer);
			}

			// Go to the next teleport destination
			spot = iterator.Next ();
			self->tracer = spot;
			if (spot)
			{
				P_Teleport (self, spot->PosAtZ(ONFLOORZ), spot->Angles.Yaw, TELF_SOURCEFOG | TELF_DESTFOG);
			}
		}
	}
	return 0;
}